

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

int __thiscall QuantNet::get_conv_weight_blob_scales(QuantNet *this)

{
  string *__lhs;
  int iVar1;
  int iVar2;
  pointer ppLVar3;
  Layer *pLVar4;
  pointer piVar5;
  bool bVar6;
  uint uVar7;
  mapped_type *pmVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  byte bVar13;
  undefined4 uVar14;
  ulong unaff_R12;
  long lVar15;
  ulong uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  undefined1 auVar17 [16];
  float fVar18;
  vector<float,_std::allocator<float>_> scales;
  Mat weight_data_n;
  string name;
  float local_dc;
  _Vector_base<float,_std::allocator<float>_> local_d8;
  Mat local_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  *local_78;
  uint local_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  QuantNet *local_60;
  ulong local_58;
  key_type local_50;
  
  local_78 = &this->weight_scales;
  local_58 = 0;
  local_60 = this;
  while( true ) {
    ppLVar3 = (local_60->super_Net).layers.
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_60->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppLVar3 >> 3) <= local_58) break;
    pLVar4 = ppLVar3[local_58];
    __lhs = &pLVar4->type;
    bVar6 = std::operator==(__lhs,"Convolution");
    local_68 = __lhs;
    if (bVar6) {
      std::__cxx11::string::string((string *)&local_50,(string *)&pLVar4->name);
      iVar9 = *(int *)&pLVar4[1]._vptr_Layer;
      local_6c = *(int *)((long)&pLVar4[1].name._M_dataplus._M_p + 4) / iVar9;
      local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar1._0_1_ = pLVar4[1].one_blob_only;
      iVar1._1_1_ = pLVar4[1].support_inplace;
      iVar1._2_1_ = pLVar4[1].support_vulkan;
      iVar1._3_1_ = pLVar4[1].support_packing;
      auVar17._0_4_ = -(uint)(pLVar4[1].typeindex == 1);
      auVar17._4_4_ = -(uint)(*(int *)&pLVar4[1].type._M_dataplus._M_p == 1);
      auVar17._8_4_ = -(uint)(*(int *)((long)&pLVar4[1].type._M_dataplus._M_p + 4) == 1);
      auVar17._12_4_ = -(uint)((int)pLVar4[1].type._M_string_length == 1);
      uVar14 = movmskps((int)unaff_R12,auVar17);
      bVar13 = (byte)uVar14;
      bVar13 = bVar13 >> 1 &
               (iVar1 == 3 && *(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 3) & bVar13 &
               bVar13 >> 2 & (bVar13 & 8) >> 3;
      unaff_R12 = (ulong)CONCAT31((int3)((uint)uVar14 >> 8),bVar13);
      sVar12 = (size_t)(int)local_6c;
      uVar16 = 0;
      if (0 < (int)local_6c) {
        uVar16 = (ulong)local_6c;
      }
      lVar15 = 0;
      for (lVar11 = 0; lVar11 < iVar9; lVar11 = lVar11 + 1) {
        local_b8.elemsize = (size_t)pLVar4[2].type._M_dataplus._M_p;
        local_b8.data = (void *)(lVar11 * sVar12 * local_b8.elemsize + (long)pLVar4[2]._vptr_Layer);
        local_b8.elempack = (int)pLVar4[2].type._M_string_length;
        local_b8.allocator = (Allocator *)pLVar4[2].type.field_2._M_allocated_capacity;
        local_b8.refcount = (int *)0x0;
        local_b8.dims = 1;
        local_b8.w = local_6c;
        local_b8.h = 1;
        local_b8.c = 1;
        local_dc = 1.1754944e-38;
        for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
          fVar18 = ABS(*(float *)((long)pLVar4[2]._vptr_Layer +
                                 uVar10 * 4 + local_b8.elemsize * lVar15));
          if (fVar18 <= local_dc) {
            fVar18 = local_dc;
          }
          local_dc = fVar18;
        }
        local_b8.cstep = sVar12;
        if (bVar13 == 0) {
          local_dc = 127.0 / local_dc;
          std::vector<float,_std::allocator<float>_>::emplace_back<float>
                    ((vector<float,_std::allocator<float>_> *)&local_d8,&local_dc);
        }
        else {
          local_dc = 31.0 / local_dc;
          std::vector<float,_std::allocator<float>_>::emplace_back<float>
                    ((vector<float,_std::allocator<float>_> *)&local_d8,&local_dc);
        }
        ncnn::Mat::~Mat(&local_b8);
        iVar9 = *(int *)&pLVar4[1]._vptr_Layer;
        lVar15 = lVar15 + sVar12;
      }
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::operator[](local_78,&local_50);
      std::vector<float,_std::allocator<float>_>::operator=
                (pmVar8,(vector<float,_std::allocator<float>_> *)&local_d8);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
      std::__cxx11::string::~string((string *)&local_50);
    }
    __lhs_00 = local_68;
    bVar6 = std::operator==(local_68,"ConvolutionDepthWise");
    if (bVar6) {
      std::__cxx11::string::string((string *)&local_50,(string *)&pLVar4->name);
      iVar9 = (int)pLVar4[1].name._M_string_length;
      uVar16 = (long)*(int *)((long)&pLVar4[1].name._M_dataplus._M_p + 4) / (long)iVar9;
      uVar7 = (uint)uVar16;
      local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar12 = (size_t)(int)uVar7;
      unaff_R12 = 0;
      if (0 < (int)uVar7) {
        unaff_R12 = uVar16 & 0xffffffff;
      }
      lVar15 = 0;
      for (lVar11 = 0; lVar11 < iVar9; lVar11 = lVar11 + 1) {
        local_b8.elemsize = pLVar4[2].type._M_string_length;
        local_b8.data =
             (void *)(lVar11 * sVar12 * local_b8.elemsize + *(long *)&pLVar4[2].one_blob_only);
        local_b8.elempack = *(int *)&pLVar4[2].type.field_2;
        local_b8.allocator = *(Allocator **)((long)&pLVar4[2].type.field_2 + 8);
        local_b8.refcount = (int *)0x0;
        local_b8.dims = 1;
        local_b8.h = 1;
        local_b8.c = 1;
        local_dc = 1.1754944e-38;
        for (uVar16 = 0; unaff_R12 != uVar16; uVar16 = uVar16 + 1) {
          fVar18 = ABS(*(float *)(local_b8.elemsize * lVar15 + *(long *)&pLVar4[2].one_blob_only +
                                 uVar16 * 4));
          if (fVar18 <= local_dc) {
            fVar18 = local_dc;
          }
          local_dc = fVar18;
        }
        local_dc = 127.0 / local_dc;
        local_b8.w = uVar7;
        local_b8.cstep = sVar12;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>
                  ((vector<float,_std::allocator<float>_> *)&local_d8,&local_dc);
        ncnn::Mat::~Mat(&local_b8);
        iVar9 = (int)pLVar4[1].name._M_string_length;
        lVar15 = lVar15 + sVar12;
      }
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::operator[](local_78,&local_50);
      std::vector<float,_std::allocator<float>_>::operator=
                (pmVar8,(vector<float,_std::allocator<float>_> *)&local_d8);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
      std::__cxx11::string::~string((string *)&local_50);
      __lhs_00 = local_68;
    }
    bVar6 = std::operator==(__lhs_00,"InnerProduct");
    if (bVar6) {
      std::__cxx11::string::string((string *)&local_50,(string *)&pLVar4->name);
      iVar9 = *(int *)&pLVar4[1]._vptr_Layer;
      iVar2._0_1_ = pLVar4[1].one_blob_only;
      iVar2._1_1_ = pLVar4[1].support_inplace;
      iVar2._2_1_ = pLVar4[1].support_vulkan;
      iVar2._3_1_ = pLVar4[1].support_packing;
      uVar7 = (uint)((long)iVar2 / (long)iVar9);
      local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar12 = (size_t)(int)uVar7;
      unaff_R12 = 0;
      if (0 < (int)uVar7) {
        unaff_R12 = (long)iVar2 / (long)iVar9 & 0xffffffff;
      }
      lVar15 = 0;
      for (lVar11 = 0; lVar11 < iVar9; lVar11 = lVar11 + 1) {
        piVar5 = *(pointer *)
                  ((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                  8);
        local_b8.elemsize =
             *(size_t *)
              &pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data;
        local_b8.data = (void *)(lVar11 * sVar12 * local_b8.elemsize + (long)piVar5);
        local_b8.elempack =
             *(int *)((long)&pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                     8);
        local_b8.allocator =
             *(Allocator **)
              ((long)&pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10);
        local_b8.refcount = (int *)0x0;
        local_b8.dims = 1;
        local_b8.h = 1;
        local_b8.c = 1;
        local_dc = 1.1754944e-38;
        for (uVar16 = 0; unaff_R12 != uVar16; uVar16 = uVar16 + 1) {
          fVar18 = ABS(*(float *)((long)piVar5 + uVar16 * 4 + local_b8.elemsize * lVar15));
          if (fVar18 <= local_dc) {
            fVar18 = local_dc;
          }
          local_dc = fVar18;
        }
        local_dc = 127.0 / local_dc;
        local_b8.w = uVar7;
        local_b8.cstep = sVar12;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>
                  ((vector<float,_std::allocator<float>_> *)&local_d8,&local_dc);
        ncnn::Mat::~Mat(&local_b8);
        iVar9 = *(int *)&pLVar4[1]._vptr_Layer;
        lVar15 = lVar15 + sVar12;
      }
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::operator[](local_78,&local_50);
      std::vector<float,_std::allocator<float>_>::operator=
                (pmVar8,(vector<float,_std::allocator<float>_> *)&local_d8);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
      std::__cxx11::string::~string((string *)&local_50);
    }
    local_58 = local_58 + 1;
  }
  return 0;
}

Assistant:

int QuantNet::get_conv_weight_blob_scales()
{
    for (size_t i=0; i<layers.size(); i++)
    {
        ncnn::Layer* layer = layers[i];
        
        if (layer->type == "Convolution")
        {
            std::string name = layer->name;
            const int weight_data_size_output = ((ncnn::Convolution*)layer)->weight_data_size / ((ncnn::Convolution*)layer)->num_output;
            std::vector<float> scales;

            // int8 winograd F43 needs weight data to use 6bit quantization
            bool quant_6bit = false;
            int kernel_w = ((ncnn::Convolution*)layer)->kernel_w;
            int kernel_h = ((ncnn::Convolution*)layer)->kernel_h;
            int dilation_w = ((ncnn::Convolution*)layer)->dilation_w;
            int dilation_h = ((ncnn::Convolution*)layer)->dilation_h;
            int stride_w = ((ncnn::Convolution*)layer)->stride_w;
            int stride_h = ((ncnn::Convolution*)layer)->stride_h;

            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                quant_6bit = true;

            for (int n=0; n<((ncnn::Convolution*)layer)->num_output; n++)
            {
                const ncnn::Mat weight_data_n = ((ncnn::Convolution*)layer)->weight_data.range(weight_data_size_output * n, weight_data_size_output);
                const float *data_n = weight_data_n;
                float max_value = std::numeric_limits<float>::min();

                for (int i = 0; i < weight_data_size_output; i++)
                    max_value = std::max(max_value, std::fabs(data_n[i]));

                if (quant_6bit)
                    scales.push_back(31 / max_value);
                else
                    scales.push_back(127 / max_value);
            }

            weight_scales[name] = scales;
        }
        
        if (layer->type == "ConvolutionDepthWise")
        {
            std::string name = layer->name;
            const int weight_data_size_output = ((ncnn::ConvolutionDepthWise*)layer)->weight_data_size / ((ncnn::ConvolutionDepthWise*)layer)->group;
            std::vector<float> scales;

            for (int n=0; n<((ncnn::ConvolutionDepthWise*)layer)->group; n++)
            {
                const ncnn::Mat weight_data_n = ((ncnn::ConvolutionDepthWise*)layer)->weight_data.range(weight_data_size_output * n, weight_data_size_output);
                const float *data_n = weight_data_n;
                float max_value = std::numeric_limits<float>::min();

                for (int i = 0; i < weight_data_size_output; i++)
                    max_value = std::max(max_value, std::fabs(data_n[i]));

                scales.push_back(127 / max_value); 
            }

            weight_scales[name] = scales;                
        }

        if (layer->type == "InnerProduct")
        {
            std::string name = layer->name;
            const int weight_data_size_output = ((ncnn::InnerProduct*)layer)->weight_data_size / ((ncnn::InnerProduct*)layer)->num_output;
            std::vector<float> scales;

            for (int n=0; n<((ncnn::InnerProduct*)layer)->num_output; n++)
            {
                const ncnn::Mat weight_data_n = ((ncnn::InnerProduct*)layer)->weight_data.range(weight_data_size_output * n, weight_data_size_output);
                const float *data_n = weight_data_n;
                float max_value = std::numeric_limits<float>::min();

                for (int i = 0; i < weight_data_size_output; i++)
                    max_value = std::max(max_value, std::fabs(data_n[i]));

                scales.push_back(127 / max_value);
            }

            weight_scales[name] = scales;            
        }
    }              

    return 0;
}